

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O2

void irr::executeBlit_TextureCombineColor_32_to_24(SBlitJob *job)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  void *pvVar9;
  u32 uVar10;
  uint uVar11;
  ulong uVar12;
  u32 *puVar13;
  u32 *puVar14;
  uint uVar15;
  ulong uVar16;
  void *local_60;
  
  uVar6 = job->width;
  uVar7 = job->height;
  local_60 = job->dst;
  if (job->stretch == true) {
    fVar1 = (float)job->x_stretch;
    fVar2 = (float)job->y_stretch;
    for (uVar11 = 0; uVar11 != uVar7; uVar11 = uVar11 + 1) {
      iVar8 = job->srcPitch;
      pvVar9 = job->src;
      uVar15 = 0;
      for (uVar12 = 0; (ulong)uVar6 * 3 != uVar12; uVar12 = uVar12 + 3) {
        uVar16 = uVar12 & 0xffffffff;
        bVar3 = *(byte *)((long)local_60 + uVar16);
        bVar4 = *(byte *)((long)local_60 + uVar16 + 1);
        bVar5 = *(byte *)((long)local_60 + uVar16 + 2);
        uVar10 = PixelMul32_2(*(u32 *)((long)pvVar9 +
                                      ((long)((float)uVar15 * fVar1) & 0xffffffffU) * 4 +
                                      (ulong)(uint)((int)(long)((float)uVar11 * fVar2) * iVar8)),
                              job->argb);
        uVar10 = PixelCombine32((uint)bVar5 | (uint)bVar4 << 8 | (uint)bVar3 << 0x10 | 0xff000000,
                                uVar10);
        *(char *)((long)local_60 + uVar16) = (char)(uVar10 >> 0x10);
        *(char *)((long)local_60 + uVar16 + 1) = (char)(uVar10 >> 8);
        *(char *)((long)local_60 + uVar16 + 2) = (char)uVar10;
        uVar15 = uVar15 + 1;
      }
      local_60 = (void *)((long)local_60 + (ulong)job->dstPitch);
    }
  }
  else {
    puVar14 = (u32 *)job->src;
    for (uVar11 = 0; uVar11 != uVar7; uVar11 = uVar11 + 1) {
      puVar13 = puVar14;
      for (uVar12 = 0; (ulong)uVar6 * 3 != uVar12; uVar12 = uVar12 + 3) {
        uVar16 = uVar12 & 0xffffffff;
        bVar3 = *(byte *)((long)local_60 + uVar16);
        bVar4 = *(byte *)((long)local_60 + uVar16 + 1);
        bVar5 = *(byte *)((long)local_60 + uVar16 + 2);
        uVar10 = PixelMul32_2(*puVar13,job->argb);
        uVar10 = PixelCombine32((uint)bVar5 | (uint)bVar4 << 8 | (uint)bVar3 << 0x10 | 0xff000000,
                                uVar10);
        *(char *)((long)local_60 + uVar16) = (char)(uVar10 >> 0x10);
        *(char *)((long)local_60 + uVar16 + 1) = (char)(uVar10 >> 8);
        *(char *)((long)local_60 + uVar16 + 2) = (char)uVar10;
        puVar13 = puVar13 + 1;
      }
      puVar14 = (u32 *)((long)puVar14 + (long)job->srcPitch);
      local_60 = (void *)((long)local_60 + (ulong)job->dstPitch);
    }
  }
  return;
}

Assistant:

static void executeBlit_TextureCombineColor_32_to_24(const SBlitJob *job)
{
	const u32 w = job->width;
	const u32 h = job->height;
	const u32 *src = static_cast<const u32 *>(job->src);
	u8 *dst = static_cast<u8 *>(job->dst);

	if (job->stretch) {
		const float wscale = job->x_stretch;
		const float hscale = job->y_stretch;

		for (u32 dy = 0; dy < h; ++dy) {
			const u32 src_y = (u32)(dy * hscale);
			src = (u32 *)((u8 *)(job->src) + job->srcPitch * src_y);

			for (u32 dx = 0; dx < w; ++dx) {
				const u32 src_x = src[(u32)(dx * wscale)];
				u8 *writeTo = &dst[dx * 3];
				const u32 dst_x = 0xFF000000 | writeTo[0] << 16 | writeTo[1] << 8 | writeTo[2];
				const u32 combo = PixelCombine32(dst_x, PixelMul32_2(src_x, job->argb));
				*writeTo++ = (combo >> 16) & 0xFF;
				*writeTo++ = (combo >> 8) & 0xFF;
				*writeTo++ = combo & 0xFF;
			}
			dst += job->dstPitch;
		}
	} else {
		for (u32 dy = 0; dy != h; ++dy) {
			for (u32 dx = 0; dx != w; ++dx) {
				u8 *writeTo = &dst[dx * 3];
				const u32 dst_x = 0xFF000000 | writeTo[0] << 16 | writeTo[1] << 8 | writeTo[2];
				const u32 combo = PixelCombine32(dst_x, PixelMul32_2(src[dx], job->argb));
				*writeTo++ = (combo >> 16) & 0xFF;
				*writeTo++ = (combo >> 8) & 0xFF;
				*writeTo++ = combo & 0xFF;
			}

			src = (u32 *)((u8 *)(src) + job->srcPitch);
			dst += job->dstPitch;
		}
	}
}